

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *
Catch::sortTests(vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__return_storage_ptr__,
                IConfig *config,
                vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *unsortedTestCases)

{
  int iVar1;
  RandomNumberGenerator rng;
  RandomNumberGenerator local_11;
  
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
            (__return_storage_ptr__,unsortedTestCases);
  iVar1 = (*(config->super_IShared).super_NonCopyable._vptr_NonCopyable[0xe])(config);
  if (iVar1 == 1) {
    std::
    __sort<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,__gnu_cxx::__ops::_Iter_comp_iter<Catch::LexSort>>
              ((__return_storage_ptr__->
               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__return_storage_ptr__->
               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  }
  else if (iVar1 == 2) {
    seedRng(config);
    std::
    random_shuffle<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,Catch::RandomNumberGenerator&>
              ((__return_storage_ptr__->
               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
               super__Vector_impl_data._M_start,
               (__return_storage_ptr__->
               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
               super__Vector_impl_data._M_finish,&local_11);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<TestCase> sortTests( IConfig const& config, std::vector<TestCase> const& unsortedTestCases ) {

        std::vector<TestCase> sorted = unsortedTestCases;

        switch( config.runOrder() ) {
            case RunTests::InLexicographicalOrder:
                std::sort( sorted.begin(), sorted.end(), LexSort() );
                break;
            case RunTests::InRandomOrder:
                {
                    seedRng( config );

                    RandomNumberGenerator rng;
                    std::random_shuffle( sorted.begin(), sorted.end(), rng );
                }
                break;
            case RunTests::InDeclarationOrder:
                // already in declaration order
                break;
        }
        return sorted;
    }